

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O2

sexp sexp_reverse_op(sexp ctx,sexp self,sexp_sint_t n,sexp ls)

{
  sexp tail;
  sexp_gc_var_t *n_00;
  sexp_gc_var_t *extraout_RDX;
  sexp local_28;
  sexp_gc_var_t local_20;
  
  local_20.var = &local_28;
  n_00 = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_20;
  tail = (sexp)&DAT_0000023e;
  local_20.next = n_00;
  for (; (((ulong)ls & 3) == 0 && (ls->tag == 6)); ls = (ls->value).type.cpl) {
    local_28 = tail;
    tail = sexp_cons_op(ctx,self,(sexp_sint_t)n_00,(ls->value).type.name,tail);
    n_00 = extraout_RDX;
  }
  (ctx->value).context.saves = local_20.next;
  return tail;
}

Assistant:

sexp sexp_reverse_op (sexp ctx, sexp self, sexp_sint_t n, sexp ls) {
  sexp_gc_var1(res);
  sexp_gc_preserve1(ctx, res);
  for (res=SEXP_NULL; sexp_pairp(ls); ls=sexp_cdr(ls))
    res = sexp_cons(ctx, sexp_car(ls), res);
  sexp_gc_release1(ctx);
  return res;
}